

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

string * __thiscall
pbrt::MediumInteraction::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumInteraction *this)

{
  ulong uVar1;
  MediumInterface *this_00;
  ulong uVar2;
  char *local_a8;
  char *local_a0;
  string local_98;
  string local_78;
  char *local_58;
  string local_50;
  
  uVar1 = (this->super_Interaction).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_a0 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_50,&(this->super_Interaction).medium);
    local_a0 = local_50._M_dataplus._M_p;
  }
  this_00 = (this->super_Interaction).mediumInterface;
  local_a8 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    MediumInterface::ToString_abi_cxx11_(&local_78,this_00);
    local_a8 = local_78._M_dataplus._M_p;
  }
  uVar2 = (this->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
  local_58 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    PhaseFunctionHandle::ToString_abi_cxx11_(&local_98,&this->phase);
    local_58 = local_98._M_dataplus._M_p;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,char_const*,char_const*,char_const*>
            (__return_storage_ptr__,
             "[ MediumInteraction pi: %s n: %s uv: %s wo: %s time: %s sigma_a: %s sigma_s: %s sigma_maj: %s Le: %s medium: %s mediumInterface: %s phase: %s ]"
             ,(Point3fi *)this,&(this->super_Interaction).n,&(this->super_Interaction).uv,
             &(this->super_Interaction).wo,&(this->super_Interaction).time,&this->sigma_a,
             &this->sigma_s,&this->sigma_maj,&this->Le,&local_a0,&local_a8,&local_58);
  if (((uVar2 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2)) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((this_00 != (MediumInterface *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (((uVar1 & 0xffffffffffff) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MediumInteraction::ToString() const {
    return StringPrintf(
        "[ MediumInteraction pi: %s n: %s uv: %s wo: %s time: %s "
        "sigma_a: %s sigma_s: %s sigma_maj: %s Le: %s medium: %s mediumInterface: %s "
        "phase: %s ]",
        pi, n, uv, wo, time, sigma_a, sigma_s, sigma_maj, Le,
        medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)",
        phase ? phase.ToString().c_str() : "(nullptr)");
}